

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strftime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  tm *ptVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  time_t t;
  long local_60;
  uint local_54;
  uint local_50;
  int nLen;
  char *local_48;
  long local_40;
  char *local_38;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) goto LAB_0012e3dc;
  pcVar7 = jx9_value_to_string(*apArg,&nLen);
  if (nLen < 1) {
    jx9_result_bool(pCtx,0);
  }
  if (nArg == 1) {
    time(&t);
  }
  else {
    if ((apArg[1]->iFlags & 2) != 0) {
      t = jx9_value_to_int64(apArg[1]);
      ptVar8 = localtime(&t);
      if (ptVar8 != (tm *)0x0) goto LAB_0012e04c;
    }
    time(&t);
  }
LAB_0012e04c:
  ptVar8 = localtime(&t);
  uVar2 = ptVar8->tm_hour;
  uVar9 = (ulong)(uint)ptVar8->tm_sec;
  uVar10 = (ulong)(uint)ptVar8->tm_min;
  uVar3 = ptVar8->tm_mday;
  uVar4 = ptVar8->tm_yday;
  local_50 = ptVar8->tm_wday;
  uVar15 = ptVar8->tm_year + 0x76c;
  local_54 = (int)uVar15 / 100;
  pcVar17 = pcVar7 + nLen;
  uVar1 = ptVar8->tm_mon + 1;
  uVar12 = (int)uVar2 % 0xc + 1;
  local_48 = "AM";
  if (0xc < (int)uVar2) {
    local_48 = "PM";
  }
  local_38 = "am";
  if (0xc < (int)uVar2) {
    local_38 = "pm";
  }
  local_40 = (long)(ptVar8->tm_mon % 0xc);
  local_60 = (long)((int)local_50 % 7);
  while( true ) {
    iVar13 = 0;
    pcVar6 = pcVar7;
    while ((pcVar18 = pcVar6 + 1, pcVar6 < pcVar17 && (*pcVar6 != '%'))) {
      iVar13 = iVar13 + 1;
      pcVar6 = pcVar18;
    }
    if (pcVar7 < pcVar6) {
      jx9_result_string(pCtx,pcVar7,iVar13);
    }
    if (pcVar17 <= pcVar18) break;
    switch(*pcVar18) {
    case '%':
      pcVar7 = "%";
      goto LAB_0012e3bc;
    default:
      goto switchD_0012e166_caseD_26;
    case 'A':
      pcVar7 = zEngDay[local_60];
      goto LAB_0012e27d;
    case 'B':
      pcVar7 = zEngMonth[local_40];
      goto LAB_0012e27d;
    case 'C':
      pcVar7 = "%2d";
      uVar11 = (ulong)local_54;
      break;
    case 'D':
    case 'x':
      pcVar7 = "%02d/%02d/%02d";
      uVar14 = (ulong)uVar1;
      uVar11 = (ulong)uVar3;
      uVar16 = (ulong)(uint)((int)uVar15 % 100);
      goto LAB_0012e2ac;
    case 'F':
      pcVar7 = "%d-%02d-%02d";
      uVar14 = (ulong)uVar15;
      uVar11 = (ulong)uVar1;
      uVar16 = (ulong)uVar3;
      goto LAB_0012e2ac;
    case 'G':
    case 'Y':
      pcVar7 = "%4d";
      uVar11 = (ulong)uVar15;
      break;
    case 'H':
      pcVar7 = "%02d";
      uVar11 = (ulong)uVar2;
      break;
    case 'I':
      pcVar7 = "%02d";
      goto LAB_0012e355;
    case 'M':
      uVar11 = uVar10;
      goto LAB_0012e34c;
    case 'P':
      iVar13 = 2;
      pcVar7 = local_38;
      goto LAB_0012e3c2;
    case 'R':
      jx9_result_string_format(pCtx,"%02d:%02d",(ulong)uVar2,uVar10);
      goto switchD_0012e166_caseD_26;
    case 'S':
      uVar11 = uVar9;
LAB_0012e34c:
      pcVar7 = "%02d";
      break;
    case 'T':
    case 'X':
      pcVar7 = "%02d:%02d:%02d";
      uVar14 = (ulong)uVar2;
      uVar11 = uVar10;
      uVar16 = uVar9;
LAB_0012e2ac:
      jx9_result_string_format(pCtx,pcVar7,uVar14,uVar11,uVar16);
      goto switchD_0012e166_caseD_26;
    case 'Z':
    case 'z':
      pcVar7 = "GMT";
LAB_0012e27d:
      iVar13 = -1;
      goto LAB_0012e3c2;
    case 'a':
      pcVar7 = zEngDay[local_60];
      goto LAB_0012e3a8;
    case 'b':
    case 'h':
      pcVar7 = zEngMonth[local_40];
LAB_0012e3a8:
      iVar13 = 3;
      goto LAB_0012e3c2;
    case 'c':
      jx9_result_string_format
                (pCtx,"%d-%02d-%02d %02d:%02d:%02d",(ulong)uVar15,(ulong)uVar1,(ulong)uVar3,
                 (ulong)uVar2,uVar10,uVar9);
      goto switchD_0012e166_caseD_26;
    case 'd':
    case 'm':
      pcVar7 = "%02d";
      uVar11 = (ulong)uVar1;
      break;
    case 'e':
      pcVar7 = "%2d";
      uVar11 = (ulong)uVar3;
      break;
    case 'g':
    case 'y':
      pcVar7 = "%2d";
      uVar11 = (ulong)(uint)((int)uVar15 % 100);
      break;
    case 'j':
      pcVar7 = "%03d";
      uVar11 = (ulong)uVar4;
      break;
    case 'l':
      pcVar7 = "%2d";
LAB_0012e355:
      uVar11 = (ulong)uVar12;
      break;
    case 'n':
      pcVar7 = "\n";
      goto LAB_0012e3bc;
    case 'p':
      iVar13 = 2;
      pcVar7 = local_48;
      goto LAB_0012e3c2;
    case 'r':
      jx9_result_string_format(pCtx,"%02d:%02d:%02d %s",(ulong)uVar12,uVar10,uVar9,local_48);
      goto switchD_0012e166_caseD_26;
    case 's':
      time(&t);
      pcVar7 = "%u";
      uVar5 = (uint)t;
      goto LAB_0012e318;
    case 't':
      pcVar7 = "\t";
LAB_0012e3bc:
      iVar13 = 1;
LAB_0012e3c2:
      jx9_result_string(pCtx,pcVar7,iVar13);
      goto switchD_0012e166_caseD_26;
    case 'u':
      pcVar7 = "%d";
      uVar5 = aISO8601[local_60];
LAB_0012e318:
      uVar11 = (ulong)uVar5;
      break;
    case 'w':
      pcVar7 = "%d";
      uVar11 = (ulong)local_50;
    }
    jx9_result_string_format(pCtx,pcVar7,uVar11);
switchD_0012e166_caseD_26:
    pcVar7 = pcVar6 + 2;
  }
  if ((pCtx->pRet->sBlob).nByte != 0) {
    return 0;
  }
LAB_0012e3dc:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strftime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Format the given string */
	jx9Strftime(pCtx, zFormat, nLen, &sTm);
	if( jx9_context_result_buf_length(pCtx) < 1 ){
		/* Nothing was formatted, return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}